

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O2

REF_STATUS ref_mpi_alltoall(REF_MPI ref_mpi,void *send,void *recv,REF_TYPE type)

{
  if (type == 3) {
    *(undefined8 *)recv = *send;
  }
  else if (type == 2) {
    *(undefined8 *)recv = *send;
  }
  else {
    if (type != 1) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x1f8,
             "ref_mpi_alltoall",6,"data type");
      return 6;
    }
    *(undefined4 *)recv = *send;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_alltoall(REF_MPI ref_mpi, void *send, void *recv,
                                    REF_TYPE type) {
#ifdef HAVE_MPI
  MPI_Datatype datatype;

  SUPRESS_UNUSED_COMPILER_WARNING(ref_mpi);

  ref_type_mpi_type(type, datatype);

  MPI_Alltoall(send, 1, datatype, recv, 1, datatype, ref_mpi_comm(ref_mpi));
#else
  switch (type) {
    case REF_INT_TYPE:
      ((REF_INT *)recv)[0] = ((REF_INT *)send)[0];
      break;
    case REF_LONG_TYPE:
      ((REF_LONG *)recv)[0] = ((REF_LONG *)send)[0];
      break;
    case REF_DBL_TYPE:
      ((REF_DBL *)recv)[0] = ((REF_DBL *)send)[0];
      break;
    default:
      RSS(REF_IMPLEMENT, "data type");
  }
  SUPRESS_UNUSED_COMPILER_WARNING(ref_mpi);
#endif

  return REF_SUCCESS;
}